

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumBilerpTexture::Evaluate
          (SpectrumBilerpTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  anon_class_24_3_48d30edf func;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar11;
  initializer_list<float> v;
  span<const_pbrt::SampledSpectrum> v_00;
  array<float,_2> local_a8;
  Tuple2<pbrt::Vector2,_float> local_a0;
  undefined8 local_98;
  Vector2f *local_90;
  undefined8 *local_88;
  SampledSpectrum *local_80;
  undefined8 **ppuStack_78;
  Vector2f **local_70;
  SampledSpectrum local_68;
  undefined1 auStack_58 [16];
  undefined1 auStack_48 [16];
  undefined1 auStack_38 [16];
  undefined1 extraout_var [56];
  undefined1 auVar10 [56];
  
  local_88 = &local_98;
  ppuStack_78 = &local_88;
  local_90 = (Vector2f *)&local_a0;
  local_80 = &local_68;
  local_98 = 0;
  local_70 = &local_90;
  local_a0.x = 0.0;
  local_a0.y = 0.0;
  local_68.values.values = ctx._0_16_;
  auStack_58 = ctx._16_16_;
  auStack_48 = ctx._32_16_;
  auStack_38 = ctx._48_16_;
  func.dstdx = (Vector2f **)ppuStack_78;
  func.ctx = (TextureEvalContext *)local_80;
  func.dstdy = local_70;
  auVar5._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar5._8_56_ = extraout_var;
  local_80 = (SampledSpectrum *)vmovlps_avx(auVar5._0_16_);
  v._M_len = 2;
  v._M_array = (iterator)&local_80;
  auVar10 = extraout_var;
  pstd::array<float,_2>::array(&local_a8,v);
  SVar11 = TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
           ::
           Dispatch<pbrt::SpectrumHandle::Sample(pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
                       *)&this->v00,&lambda);
  auVar6._0_8_ = SVar11.values.values._0_8_;
  auVar6._8_56_ = auVar10;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = SVar11.values.values._8_8_;
  local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar1);
  auVar10 = ZEXT856(local_68.values.values._8_8_);
  SVar11 = TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
           ::
           Dispatch<pbrt::SpectrumHandle::Sample(pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
                       *)&this->v10,&lambda);
  auVar7._0_8_ = SVar11.values.values._0_8_;
  auVar7._8_56_ = auVar10;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar11.values.values._8_8_;
  auStack_58 = vmovlhps_avx(auVar7._0_16_,auVar2);
  auVar10 = ZEXT856(auStack_58._8_8_);
  SVar11 = TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
           ::
           Dispatch<pbrt::SpectrumHandle::Sample(pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
                       *)&this->v01,&lambda);
  auVar8._0_8_ = SVar11.values.values._0_8_;
  auVar8._8_56_ = auVar10;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = SVar11.values.values._8_8_;
  auStack_48 = vmovlhps_avx(auVar8._0_16_,auVar3);
  auVar10 = ZEXT856(auStack_48._8_8_);
  SVar11 = TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
           ::
           Dispatch<pbrt::SpectrumHandle::Sample(pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBAlbedoSpectrum,pbrt::RGBUnboundedSpectrum,pbrt::RGBIlluminantSpectrum,pbrt::BlackbodySpectrum>
                       *)&this->v11,&lambda);
  auVar9._0_8_ = SVar11.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = SVar11.values.values._8_8_;
  auStack_38 = vmovlhps_avx(auVar9._0_16_,auVar4);
  v_00.n = 4;
  v_00.ptr = &local_68;
  SVar11 = Bilerp(local_a8,v_00);
  return (array<float,_4>)(array<float,_4>)SVar11;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Bilerp({st[0], st[1]}, {v00.Sample(lambda), v10.Sample(lambda),
                                       v01.Sample(lambda), v11.Sample(lambda)});
    }